

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O0

KUINT16 __thiscall
KDIS::KDataStream::CopyIntoBuffer
          (KDataStream *this,KOCTET *Buffer,KUINT16 BufferSize,KUINT16 WritePos)

{
  bool bVar1;
  size_type sVar2;
  KException *this_00;
  reference puVar3;
  ushort local_42;
  const_iterator cStack_40;
  KUINT16 CurrentWritePos;
  const_iterator citrEnd;
  const_iterator citr;
  KUINT16 WritePos_local;
  KUINT16 BufferSize_local;
  KOCTET *Buffer_local;
  KDataStream *this_local;
  
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_vBuffer);
  if ((int)((uint)BufferSize - (uint)WritePos) < (int)((uint)sVar2 & 0xffff)) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    KException::KException(this_00,1);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  citrEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_vBuffer);
  cStack_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->m_vBuffer);
  local_42 = WritePos;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&citrEnd);
    Buffer[local_42] = *puVar3;
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&citrEnd);
    local_42 = local_42 + 1;
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_vBuffer);
  return (KUINT16)sVar2;
}

Assistant:

KUINT16 KDataStream::CopyIntoBuffer(KOCTET *Buffer, KUINT16 BufferSize, KUINT16 WritePos /*= 0*/ ) const noexcept(false)
{
    if( ( BufferSize - WritePos ) < ( KUINT16 )m_vBuffer.size() )
    {
        throw KException( BUFFER_TOO_SMALL );
    }

    auto citr = m_vBuffer.begin();
    auto citrEnd = m_vBuffer.end();

    KUINT16 CurrentWritePos = WritePos;

    for( ; citr != citrEnd; ++citr, ++CurrentWritePos )
    {
        Buffer[CurrentWritePos] = *citr;
    }

    return static_cast<KUINT16>(m_vBuffer.size());
}